

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O2

void __thiscall DIS::SeesPdu::unmarshal(SeesPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  PropulsionSystemData x;
  PropulsionSystemData local_40;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_orginatingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_infraredSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_acousticSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_radarCrossSectionSignatureRepresentationIndex);
  DataStream::operator>>(dataStream,&this->_numberOfPropulsionSystems);
  DataStream::operator>>(dataStream,&this->_numberOfVectoringNozzleSystems);
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::clear
            (&this->_propulsionSystemData);
  for (uVar1 = 0; uVar1 < this->_numberOfPropulsionSystems; uVar1 = uVar1 + 1) {
    PropulsionSystemData::PropulsionSystemData(&local_40);
    PropulsionSystemData::unmarshal(&local_40,dataStream);
    std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::push_back
              (&this->_propulsionSystemData,&local_40);
    PropulsionSystemData::~PropulsionSystemData(&local_40);
  }
  std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::clear
            (&this->_vectoringSystemData);
  for (uVar1 = 0; uVar1 < this->_numberOfVectoringNozzleSystems; uVar1 = uVar1 + 1) {
    VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)&local_40);
    VectoringNozzleSystem::unmarshal((VectoringNozzleSystem *)&local_40,dataStream);
    std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::push_back
              (&this->_vectoringSystemData,(value_type *)&local_40);
    VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&local_40);
  }
  return;
}

Assistant:

void SeesPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _orginatingEntityID.unmarshal(dataStream);
    dataStream >> _infraredSignatureRepresentationIndex;
    dataStream >> _acousticSignatureRepresentationIndex;
    dataStream >> _radarCrossSectionSignatureRepresentationIndex;
    dataStream >> _numberOfPropulsionSystems;
    dataStream >> _numberOfVectoringNozzleSystems;

     _propulsionSystemData.clear();
     for(size_t idx = 0; idx < _numberOfPropulsionSystems; idx++)
     {
        PropulsionSystemData x;
        x.unmarshal(dataStream);
        _propulsionSystemData.push_back(x);
     }

     _vectoringSystemData.clear();
     for(size_t idx = 0; idx < _numberOfVectoringNozzleSystems; idx++)
     {
        VectoringNozzleSystem x;
        x.unmarshal(dataStream);
        _vectoringSystemData.push_back(x);
     }
}